

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  char cVar1;
  short sVar2;
  sqlite3 *db;
  Table *pTVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  FKey *__s;
  FKey *pFVar7;
  char *pcVar8;
  ExprList_item *pEVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  Column *pCVar15;
  sColMap *z;
  char *pcVar16;
  char *pcVar17;
  
  db = pParse->db;
  pTVar3 = pParse->pNewTable;
  if ((pTVar3 != (Table *)0x0) && (pParse->declareVtab == '\0')) {
    if (pFromCol == (ExprList *)0x0) {
      if (0 < pTVar3->nCol) {
        if (pToCol == (ExprList *)0x0) {
          iVar5 = pTo->n + 0x51;
          uVar14 = 1;
          goto LAB_00141ffc;
        }
        if (pToCol->nExpr == 1) {
          iVar5 = pTo->n + 0x51;
          uVar14 = 1;
          uVar6 = 1;
          goto LAB_00141f64;
        }
        sqlite3ErrorMsg(pParse,"foreign key on %s should reference only one column of table %T",
                        pTVar3->aCol[(ushort)pTVar3->nCol - 1].zName,pTo);
      }
    }
    else {
      uVar14 = pFromCol->nExpr;
      if (pToCol == (ExprList *)0x0) {
        iVar5 = uVar14 * 0x10 + pTo->n + 0x41;
LAB_00141ffc:
        bVar4 = 0;
      }
      else {
        uVar6 = pToCol->nExpr;
        if (uVar6 != uVar14) {
          sqlite3ErrorMsg(pParse,
                          "number of columns in foreign key does not match the number of columns in the referenced table"
                         );
          goto LAB_00141ec3;
        }
        iVar5 = uVar14 * 0x10 + pTo->n + 0x41;
        if (0 < (int)uVar6) {
LAB_00141f64:
          uVar10 = 0;
          do {
            pcVar17 = pToCol->a[uVar10].zName;
            if (pcVar17 == (char *)0x0) {
              iVar13 = 1;
            }
            else {
              uVar12 = 0xffffffff;
              do {
                uVar12 = uVar12 + 1;
                cVar1 = *pcVar17;
                pcVar17 = pcVar17 + 1;
              } while (cVar1 != '\0');
              iVar13 = (uVar12 & 0x3fffffff) + 1;
            }
            iVar5 = iVar5 + iVar13;
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar6);
        }
        bVar4 = 1;
      }
      __s = (FKey *)sqlite3DbMallocRaw(db,(long)iVar5);
      if (__s != (FKey *)0x0) {
        memset(__s,0,(long)iVar5);
        __s->pFrom = pTVar3;
        __s->pNextFrom = pTVar3->pFKey;
        z = __s->aCol + (int)uVar14;
        __s->zTo = (char *)z;
        memcpy(z,pTo->z,(ulong)pTo->n);
        *(undefined1 *)((long)&z->iFrom + (ulong)pTo->n) = 0;
        sqlite3Dequote((char *)z);
        uVar6 = pTo->n;
        __s->nCol = uVar14;
        if (pFromCol == (ExprList *)0x0) {
          __s->aCol[0].iFrom = pTVar3->nCol + -1;
LAB_0014217b:
          if ((bool)(bVar4 & 0 < (int)uVar14)) {
            pcVar17 = (char *)((long)&z->iFrom + (ulong)(uVar6 + 1));
            uVar10 = 0;
            do {
              pcVar16 = pToCol->a[uVar10].zName;
              uVar6 = 0;
              if (pcVar16 != (char *)0x0) {
                uVar6 = 0xffffffff;
                pcVar8 = pcVar16;
                do {
                  uVar6 = uVar6 + 1;
                  cVar1 = *pcVar8;
                  pcVar8 = pcVar8 + 1;
                } while (cVar1 != '\0');
                uVar6 = uVar6 & 0x3fffffff;
              }
              __s->aCol[uVar10].zCol = pcVar17;
              memcpy(pcVar17,pcVar16,(ulong)uVar6);
              pcVar16 = pcVar17 + uVar6;
              pcVar17 = pcVar16 + 1;
              *pcVar16 = '\0';
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar14);
          }
        }
        else if (0 < (int)uVar14) {
          sVar2 = pTVar3->nCol;
          uVar10 = 0;
          do {
            if (sVar2 < 1) {
              pEVar9 = pFromCol->a;
              uVar10 = 0;
LAB_00142260:
              sqlite3ErrorMsg(pParse,"unknown column \"%s\" in foreign key definition",
                              pEVar9[uVar10].zName);
              goto LAB_00141ec5;
            }
            pCVar15 = pTVar3->aCol;
            pEVar9 = pFromCol->a;
            pcVar17 = pEVar9[uVar10].zName;
            lVar11 = 0;
            while (iVar5 = sqlite3_stricmp(pCVar15->zName,pcVar17), iVar5 != 0) {
              lVar11 = lVar11 + 1;
              pCVar15 = pCVar15 + 1;
              if (sVar2 == lVar11) {
                uVar10 = uVar10 & 0xffffffff;
                goto LAB_00142260;
              }
            }
            __s->aCol[uVar10].iFrom = (int)lVar11;
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar14);
          goto LAB_0014217b;
        }
        __s->isDeferred = '\0';
        __s->aAction[0] = (u8)flags;
        __s->aAction[1] = (u8)((uint)flags >> 8);
        pFVar7 = (FKey *)sqlite3HashInsert(&pTVar3->pSchema->fkeyHash,__s->zTo,__s);
        if (pFVar7 == __s) {
          db->mallocFailed = '\x01';
          goto LAB_00141ec5;
        }
        if (pFVar7 != (FKey *)0x0) {
          __s->pNextTo = pFVar7;
          pFVar7->pPrevTo = __s;
        }
        pTVar3->pFKey = __s;
      }
    }
  }
LAB_00141ec3:
  __s = (FKey *)0x0;
LAB_00141ec5:
  sqlite3DbFree(db,__s);
  sqlite3ExprListDelete(db,pFromCol);
  sqlite3ExprListDelete(db,pToCol);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  int nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  pFKey->pNextFrom = p->pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zName, pFromCol->a[i].zName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse, 
          "unknown column \"%s\" in foreign key definition", 
          pFromCol->a[i].zName);
        goto fk_end;
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zName);
      pFKey->aCol[i].zCol = z;
      memcpy(z, pToCol->a[i].zName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash, 
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    db->mallocFailed = 1;
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  p->pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}